

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

void __thiscall
flatbuffers::GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::
Module::GenerateImports(flatbuffers::CodeWriter__(void *this,CodeWriter *code)

{
  long *plVar1;
  _Rb_tree_node_base *p_Var2;
  size_type *psVar3;
  _Self __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  void *local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  _Rb_tree_node_base *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  p_Var2 = *(_Rb_tree_node_base **)((long)this + 0x18);
  local_78 = (_Rb_tree_node_base *)((long)this + 8);
  local_e0 = this;
  if (p_Var2 != local_78) {
    do {
      std::operator+(&local_100,"pub mod ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 1));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_100);
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_d8.field_2._M_allocated_capacity = *psVar3;
        local_d8.field_2._8_8_ = plVar1[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar3;
        local_d8._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_d8._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      CodeWriter::operator+=(code,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      code->cur_ident_lvl_ = code->cur_ident_lvl_ + 1;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"use super::*;","");
      CodeWriter::operator+=(code,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      CodeWriter__(p_Var2 + 2,code);
      if (code->cur_ident_lvl_ != 0) {
        code->cur_ident_lvl_ = code->cur_ident_lvl_ + -1;
      }
      std::operator+(&local_70,"} // ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 1));
      CodeWriter::operator+=(code,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != local_78);
  }
  __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           ((long)local_e0 + 0x30);
  if (__rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((long)local_e0 + 0x38)) {
    do {
      std::operator+(&local_100,"mod ",__rhs);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_100);
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_98.field_2._M_allocated_capacity = *psVar3;
        local_98.field_2._8_8_ = plVar1[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar3;
        local_98._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_98._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      CodeWriter::operator+=(code,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_100,"pub use self::",__rhs);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_100);
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_b8.field_2._M_allocated_capacity = *psVar3;
        local_b8.field_2._8_8_ = plVar1[3];
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar3;
        local_b8._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_b8._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      CodeWriter::operator+=(code,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       ((long)local_e0 + 0x38));
  }
  return;
}

Assistant:

void GenerateImports(CodeWriter &code) {
      for (auto it = sub_modules.begin(); it != sub_modules.end(); it++) {
        code += "pub mod " + it->first + " {";
        code.IncrementIdentLevel();
        code += "use super::*;";
        it->second.GenerateImports(code);
        code.DecrementIdentLevel();
        code += "} // " + it->first;
      }
      for (auto it = generated_files.begin(); it != generated_files.end();
           it++) {
        code += "mod " + *it + ";";
        code += "pub use self::" + *it + "::*;";
      }
    }